

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.h
# Opt level: O3

bool __thiscall
TTD::ThreadContextTTD::ResolveIsLongLivedForExtract(ThreadContextTTD *this,TTD_LOG_PTR_ID origId)

{
  Type piVar1;
  DictionaryStats *pDVar2;
  byte bVar3;
  uint uVar4;
  Type pSVar5;
  uint uVar6;
  
  piVar1 = (this->m_ttdMayBeLongLivedRoot).buckets;
  uVar4 = 0;
  if (piVar1 != (Type)0x0) {
    uVar4 = JsUtil::
            BaseDictionary<unsigned_long,_bool,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::GetBucket(((uint)(origId >> 0x20) ^ (uint)origId) * 2 + 1,
                        (this->m_ttdMayBeLongLivedRoot).bucketCount,
                        (this->m_ttdMayBeLongLivedRoot).modFunctionIndex);
    uVar6 = piVar1[uVar4];
    uVar4 = 0;
    if (-1 < (int)uVar6) {
      pSVar5 = (this->m_ttdMayBeLongLivedRoot).entries;
      uVar4 = 0;
      do {
        if (pSVar5[uVar6].
            super_DefaultHashedEntry<unsigned_long,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<unsigned_long,_bool>.
            super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_bool>_>
            .super_KeyValueEntryDataLayout2<unsigned_long,_bool>.key == origId) {
          pDVar2 = (this->m_ttdMayBeLongLivedRoot).stats;
          if (pDVar2 != (DictionaryStats *)0x0) {
            DictionaryStats::Lookup(pDVar2,uVar4);
            pSVar5 = (this->m_ttdMayBeLongLivedRoot).entries;
          }
          bVar3 = pSVar5[uVar6].
                  super_DefaultHashedEntry<unsigned_long,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .super_KeyValueEntry<unsigned_long,_bool>.
                  super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_bool>_>
                  .super_KeyValueEntryDataLayout2<unsigned_long,_bool>.value;
          goto LAB_00926ea7;
        }
        uVar4 = uVar4 + 1;
        uVar6 = pSVar5[uVar6].
                super_DefaultHashedEntry<unsigned_long,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<unsigned_long,_bool>.
                super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_bool>_>
                .super_KeyValueEntryDataLayout2<unsigned_long,_bool>.next;
      } while (-1 < (int)uVar6);
    }
  }
  pDVar2 = (this->m_ttdMayBeLongLivedRoot).stats;
  if (pDVar2 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(pDVar2,uVar4);
  }
  bVar3 = 0;
LAB_00926ea7:
  return (bool)(bVar3 & 1);
}

Assistant:

bool ResolveIsLongLivedForExtract(TTD_LOG_PTR_ID origId) const { return this->m_ttdMayBeLongLivedRoot.LookupWithKey(origId, false); }